

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O0

int run_test_pipe_getsockname(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  size_t sStack_420;
  int r;
  size_t len;
  char buf [1024];
  uv_loop_t *loop;
  
  puVar2 = uv_default_loop();
  if (puVar2 == (uv_loop_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,99,"loop != NULL");
    abort();
  }
  iVar1 = uv_pipe_init(puVar2,&pipe_server,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x66,"r == 0");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x6a,"r == UV_EBADF");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getpeername(&pipe_server,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x6e,"r == UV_EBADF");
    abort();
  }
  iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x71,"r == 0");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x75,"r == 0");
    abort();
  }
  if (*(char *)((long)&r + sStack_420 + 3) == '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x77,"buf[len - 1] != 0");
    abort();
  }
  if (buf[sStack_420 - 8] != '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x78,"buf[len] == \'\\0\'");
    abort();
  }
  iVar1 = memcmp(&len,"/tmp/uv-test-sock",sStack_420);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x79,"memcmp(buf, TEST_PIPENAME, len) == 0");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getpeername(&pipe_server,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x7d,"r == UV_ENOTCONN");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&pipe_server,0,pipe_server_connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x80,"r == 0");
    abort();
  }
  iVar1 = uv_pipe_init(puVar2,&pipe_client,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x83,"r == 0");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getsockname(&pipe_client,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x87,"r == UV_EBADF");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getpeername(&pipe_client,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x8b,"r == UV_EBADF");
    abort();
  }
  uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getsockname(&pipe_client,(char *)&len,&stack0xfffffffffffffbe0);
  if ((iVar1 != 0) || (sStack_420 != 0)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x91,"r == 0 && len == 0");
    abort();
  }
  sStack_420 = 0x400;
  iVar1 = uv_pipe_getpeername(&pipe_client,(char *)&len,&stack0xfffffffffffffbe0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x95,"r == 0");
    abort();
  }
  if (*(char *)((long)&r + sStack_420 + 3) == '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x97,"buf[len - 1] != 0");
    abort();
  }
  iVar1 = memcmp(&len,"/tmp/uv-test-sock",sStack_420);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x98,"memcmp(buf, TEST_PIPENAME, len) == 0");
    abort();
  }
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x9b,"r == 0");
    abort();
  }
  if (pipe_client_connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x9c,"pipe_client_connect_cb_called == 1");
    abort();
  }
  if (pipe_close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x9d,"pipe_close_cb_called == 2");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0x9f,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(pipe_getsockname) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  char buf[1024];
  size_t len;
  int r;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(buf[len] == '\0');
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_ENOTCONN);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(pipe_client_connect_cb_called == 1);
  ASSERT(pipe_close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}